

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::TightenBoundsPS::TightenBoundsPS
          (TightenBoundsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *origupper,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *origlower,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  peVar3 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006af140;
  (this->super_PostStep).m_name = "TightenBounds";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_28);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006afb38;
  this->m_j = j;
  uVar4 = *(undefined8 *)((origupper->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((origupper->m_backend).data._M_elems + 4);
  uVar6 = *(undefined8 *)((origupper->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_origupper).m_backend.data._M_elems =
       *(undefined8 *)(origupper->m_backend).data._M_elems;
  *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 2) = uVar4;
  *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 4) = uVar5;
  *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 6) = uVar6;
  *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8) =
       *(undefined8 *)((origupper->m_backend).data._M_elems + 8);
  (this->m_origupper).m_backend.exp = (origupper->m_backend).exp;
  (this->m_origupper).m_backend.neg = (origupper->m_backend).neg;
  iVar7 = (origupper->m_backend).prec_elem;
  (this->m_origupper).m_backend.fpclass = (origupper->m_backend).fpclass;
  (this->m_origupper).m_backend.prec_elem = iVar7;
  uVar4 = *(undefined8 *)((origlower->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((origlower->m_backend).data._M_elems + 4);
  uVar6 = *(undefined8 *)((origlower->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_origlower).m_backend.data._M_elems =
       *(undefined8 *)(origlower->m_backend).data._M_elems;
  *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 2) = uVar4;
  *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 4) = uVar5;
  *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 6) = uVar6;
  *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8) =
       *(undefined8 *)((origlower->m_backend).data._M_elems + 8);
  (this->m_origlower).m_backend.exp = (origlower->m_backend).exp;
  (this->m_origlower).m_backend.neg = (origlower->m_backend).neg;
  iVar7 = (origlower->m_backend).prec_elem;
  (this->m_origlower).m_backend.fpclass = (origlower->m_backend).fpclass;
  (this->m_origlower).m_backend.prec_elem = iVar7;
  return;
}

Assistant:

TightenBoundsPS(const SPxLPBase<R>& lp, int j, R origupper, R origlower,
                      std::shared_ptr<Tolerances> tols)
         : PostStep("TightenBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
         , m_origupper(origupper)
         , m_origlower(origlower)
      {
      }